

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue.hpp
# Opt level: O0

bool __thiscall
boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::
do_push<true>(queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_> *this
             ,Task **t)

{
  bool bVar1;
  tag_t tVar2;
  tagged_index *in_RSI;
  atomic<boost::lockfree::detail::tagged_index> *in_RDI;
  tagged_node_handle new_tail_1;
  tagged_node_handle new_tail;
  tagged_node_handle new_tail_next;
  tagged_node_handle tail2;
  node *next_ptr;
  tagged_node_handle next;
  node *tail_node;
  tagged_node_handle tail;
  handle_type node_handle;
  node *n;
  tagged_node_handle *in_stack_ffffffffffffff78;
  undefined2 in_stack_ffffffffffffff80;
  index_t in_stack_ffffffffffffff82;
  undefined2 in_stack_ffffffffffffff84;
  index_t i;
  index_t in_stack_ffffffffffffff86;
  fixed_size_freelist<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node,_boost::lockfree::detail::runtime_sized_freelist_storage<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node,_std::allocator<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node>_>_>
  *this_00;
  memory_order __m;
  undefined4 in_stack_ffffffffffffffa0;
  tagged_index in_stack_ffffffffffffffa4;
  tagged_index in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  tagged_index local_50;
  tagged_index local_4c;
  tagged_index local_48;
  tagged_index local_44;
  node *local_40;
  tagged_index local_34;
  node *local_30;
  tagged_index local_28;
  index_t local_24;
  index_t local_22;
  node *local_20;
  bool local_1;
  
  this_00 = (fixed_size_freelist<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node,_boost::lockfree::detail::runtime_sized_freelist_storage<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node,_std::allocator<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node>_>_>
             *)(in_RDI + 0x20);
  local_22 = detail::
             fixed_size_freelist<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node,_boost::lockfree::detail::runtime_sized_freelist_storage<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node,_std::allocator<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node>_>_>
             ::null_handle((fixed_size_freelist<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node,_boost::lockfree::detail::runtime_sized_freelist_storage<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node,_std::allocator<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node>_>_>
                            *)0x1332cf);
  local_20 = detail::
             fixed_size_freelist<boost::lockfree::queue<depspawn::internal::TaskPool::Task*,boost::lockfree::fixed_sized<true>>::node,boost::lockfree::detail::runtime_sized_freelist_storage<boost::lockfree::queue<depspawn::internal::TaskPool::Task*,boost::lockfree::fixed_sized<true>>::node,std::allocator<boost::lockfree::queue<depspawn::internal::TaskPool::Task*,boost::lockfree::fixed_sized<true>>::node>>>
             ::construct<true,true,depspawn::internal::TaskPool::Task*,unsigned_short>
                       ((fixed_size_freelist<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node,_boost::lockfree::detail::runtime_sized_freelist_storage<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node,_std::allocator<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node>_>_>
                         *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                        (Task **)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                        (unsigned_short *)in_RDI);
  local_24 = detail::
             fixed_size_freelist<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node,_boost::lockfree::detail::runtime_sized_freelist_storage<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node,_std::allocator<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node>_>_>
             ::get_handle(this_00,(node *)CONCAT26(in_stack_ffffffffffffff86,
                                                   CONCAT24(in_stack_ffffffffffffff84,
                                                            CONCAT22(in_stack_ffffffffffffff82,
                                                                     in_stack_ffffffffffffff80))));
  if (local_20 == (node *)0x0) {
    local_1 = false;
  }
  else {
    do {
      while( true ) {
        do {
          local_28 = std::atomic<boost::lockfree::detail::tagged_index>::load
                               (in_RDI + 0x10,memory_order_acquire);
          local_30 = detail::
                     fixed_size_freelist<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node,_boost::lockfree::detail::runtime_sized_freelist_storage<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node,_std::allocator<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node>_>_>
                     ::get_pointer((fixed_size_freelist<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node,_boost::lockfree::detail::runtime_sized_freelist_storage<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node,_std::allocator<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node>_>_>
                                    *)CONCAT26(in_stack_ffffffffffffff86,
                                               CONCAT24(in_stack_ffffffffffffff84,
                                                        CONCAT22(in_stack_ffffffffffffff82,
                                                                 in_stack_ffffffffffffff80))),
                                   in_stack_ffffffffffffff78);
          local_34 = std::atomic<boost::lockfree::detail::tagged_index>::load
                               (&local_30->next,memory_order_acquire);
          local_40 = detail::
                     fixed_size_freelist<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node,_boost::lockfree::detail::runtime_sized_freelist_storage<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node,_std::allocator<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node>_>_>
                     ::get_pointer((fixed_size_freelist<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node,_boost::lockfree::detail::runtime_sized_freelist_storage<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node,_std::allocator<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node>_>_>
                                    *)CONCAT26(in_stack_ffffffffffffff86,
                                               CONCAT24(in_stack_ffffffffffffff84,
                                                        CONCAT22(in_stack_ffffffffffffff82,
                                                                 in_stack_ffffffffffffff80))),
                                   in_stack_ffffffffffffff78);
          local_44 = std::atomic<boost::lockfree::detail::tagged_index>::load
                               (in_RDI + 0x10,memory_order_acquire);
          bVar1 = detail::tagged_index::operator==(&local_28,&local_44);
        } while (!bVar1);
        if (local_40 == (node *)0x0) break;
        in_stack_ffffffffffffff82 =
             detail::
             fixed_size_freelist<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node,_boost::lockfree::detail::runtime_sized_freelist_storage<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node,_std::allocator<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node>_>_>
             ::get_handle(this_00,(node *)CONCAT26(in_stack_ffffffffffffff86,
                                                   CONCAT24(in_stack_ffffffffffffff84,
                                                            CONCAT22(in_stack_ffffffffffffff82,
                                                                     in_stack_ffffffffffffff80))));
        tVar2 = detail::tagged_index::get_next_tag
                          ((tagged_index *)
                           CONCAT26(in_stack_ffffffffffffff86,
                                    CONCAT24(in_stack_ffffffffffffff84,
                                             CONCAT22(in_stack_ffffffffffffff82,
                                                      in_stack_ffffffffffffff80))));
        in_stack_ffffffffffffffa4 = in_stack_ffffffffffffffa8;
        detail::tagged_index::tagged_index
                  ((tagged_index *)&stack0xffffffffffffffa8,in_stack_ffffffffffffff82,tVar2);
        in_stack_ffffffffffffffa8 = in_stack_ffffffffffffffa4;
        std::atomic<boost::lockfree::detail::tagged_index>::compare_exchange_strong
                  (in_RDI,in_RSI,in_stack_ffffffffffffffa4,(memory_order)((ulong)this_00 >> 0x20));
      }
      in_stack_ffffffffffffff86 = local_24;
      tVar2 = detail::tagged_index::get_next_tag
                        ((tagged_index *)
                         CONCAT26(local_24,CONCAT24(in_stack_ffffffffffffff84,
                                                    CONCAT22(in_stack_ffffffffffffff82,
                                                             in_stack_ffffffffffffff80))));
      detail::tagged_index::tagged_index(&local_48,in_stack_ffffffffffffff86,tVar2);
      local_4c = local_48;
      bVar1 = std::atomic<boost::lockfree::detail::tagged_index>::compare_exchange_weak
                        (in_RDI,in_RSI,in_stack_ffffffffffffffa4,
                         (memory_order)((ulong)this_00 >> 0x20));
    } while (!bVar1);
    i = local_24;
    tVar2 = detail::tagged_index::get_next_tag
                      ((tagged_index *)
                       CONCAT26(in_stack_ffffffffffffff86,
                                CONCAT24(local_24,CONCAT22(in_stack_ffffffffffffff82,
                                                           in_stack_ffffffffffffff80))));
    __m = (memory_order)((ulong)this_00 >> 0x20);
    detail::tagged_index::tagged_index(&local_50,i,tVar2);
    std::atomic<boost::lockfree::detail::tagged_index>::compare_exchange_strong
              (in_RDI,in_RSI,in_stack_ffffffffffffffa4,__m);
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool do_push(T const & t)
    {
        node * n = pool.template construct<true, Bounded>(t, pool.null_handle());
        handle_type node_handle = pool.get_handle(n);

        if (n == NULL)
            return false;

        for (;;) {
            tagged_node_handle tail = tail_.load(memory_order_acquire);
            node * tail_node = pool.get_pointer(tail);
            tagged_node_handle next = tail_node->next.load(memory_order_acquire);
            node * next_ptr = pool.get_pointer(next);

            tagged_node_handle tail2 = tail_.load(memory_order_acquire);
            if (BOOST_LIKELY(tail == tail2)) {
                if (next_ptr == 0) {
                    tagged_node_handle new_tail_next(node_handle, next.get_next_tag());
                    if ( tail_node->next.compare_exchange_weak(next, new_tail_next) ) {
                        tagged_node_handle new_tail(node_handle, tail.get_next_tag());
                        tail_.compare_exchange_strong(tail, new_tail);
                        return true;
                    }
                }
                else {
                    tagged_node_handle new_tail(pool.get_handle(next_ptr), tail.get_next_tag());
                    tail_.compare_exchange_strong(tail, new_tail);
                }
            }
        }
    }